

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# virtual_channel.cc
# Opt level: O1

vector<std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>,_std::allocator<std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>_>_>
* __thiscall
assembler::VirtualChannel::process
          (vector<std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>,_std::allocator<std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>_>_>
           *__return_storage_ptr__,VirtualChannel *this,VCDU *vcdu)

{
  unique_ptr<assembler::TransportPDU,_std::default_delete<assembler::TransportPDU>_> *this_00;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *pvVar1;
  byte bVar2;
  raw *prVar3;
  TransportPDU *pTVar4;
  byte *pbVar5;
  _Head_base<0UL,_assembler::TransportPDU_*,_false> _Var6;
  long lVar7;
  undefined8 uVar8;
  int iVar9;
  ostream *poVar10;
  _Head_base<0UL,_assembler::TransportPDU_*,_false> this_01;
  ssize_t sVar11;
  uint uVar12;
  uint uVar13;
  size_t __nbytes_00;
  pointer __p;
  ulong uVar14;
  ulong uVar15;
  _Head_base<0UL,_assembler::TransportPDU_*,_false> local_60;
  _Head_base<0UL,_assembler::TransportPDU_*,_false> local_58;
  _Head_base<0UL,_assembler::TransportPDU_*,_false> local_50;
  vector<std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>,_std::allocator<std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>_>_>
  *local_48;
  ostream *local_40;
  TransportPDU *local_38;
  _Head_base<0UL,_assembler::TransportPDU_*,_false> __nbytes;
  
  (__return_storage_ptr__->
  super__Vector_base<std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>,_std::allocator<std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>,_std::allocator<std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>,_std::allocator<std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_48 = __return_storage_ptr__;
  if (-1 < this->n_) {
    prVar3 = vcdu->data_;
    iVar9 = diffWithWrap<16777216u>
                      (this->n_,(uint)prVar3->_M_elems[4] |
                                (uint)prVar3->_M_elems[3] << 8 | (uint)prVar3->_M_elems[2] << 0x10);
    if (1 < iVar9) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"VC ",3);
      poVar10 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,this->id_);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,": VCDU drop! (lost ",0x13);
      poVar10 = (ostream *)std::ostream::operator<<((ostream *)poVar10,iVar9 + -1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,"; prev: ",8);
      poVar10 = (ostream *)std::ostream::operator<<((ostream *)poVar10,this->n_);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,"; packet: ",10);
      prVar3 = vcdu->data_;
      poVar10 = (ostream *)
                std::ostream::operator<<
                          ((ostream *)poVar10,
                           (uint)prVar3->_M_elems[4] |
                           (uint)prVar3->_M_elems[3] << 8 | (uint)prVar3->_M_elems[2] << 0x10);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,")",1);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
      std::ostream::put((char)poVar10);
      std::ostream::flush();
      pTVar4 = (this->tpdu_)._M_t.
               super___uniq_ptr_impl<assembler::TransportPDU,_std::default_delete<assembler::TransportPDU>_>
               ._M_t.
               super__Tuple_impl<0UL,_assembler::TransportPDU_*,_std::default_delete<assembler::TransportPDU>_>
               .super__Head_base<0UL,_assembler::TransportPDU_*,_false>._M_head_impl;
      (this->tpdu_)._M_t.
      super___uniq_ptr_impl<assembler::TransportPDU,_std::default_delete<assembler::TransportPDU>_>.
      _M_t.
      super__Tuple_impl<0UL,_assembler::TransportPDU_*,_std::default_delete<assembler::TransportPDU>_>
      .super__Head_base<0UL,_assembler::TransportPDU_*,_false>._M_head_impl = (TransportPDU *)0x0;
      if (pTVar4 != (TransportPDU *)0x0) {
        std::default_delete<assembler::TransportPDU>::operator()
                  ((default_delete<assembler::TransportPDU> *)&this->tpdu_,pTVar4);
      }
    }
  }
  prVar3 = vcdu->data_;
  uVar12 = (uint)prVar3->_M_elems[3] << 8 | (uint)prVar3->_M_elems[2] << 0x10;
  __nbytes._M_head_impl = (TransportPDU *)(ulong)uVar12;
  this->n_ = prVar3->_M_elems[4] | uVar12;
  uVar12 = (prVar3->_M_elems[6] & 7) << 8;
  bVar2 = prVar3->_M_elems[7];
  uVar15 = (ulong)bVar2 | (ulong)uVar12;
  iVar9 = (int)prVar3 + 8;
  this_00 = &this->tpdu_;
  pTVar4 = (this->tpdu_)._M_t.
           super___uniq_ptr_impl<assembler::TransportPDU,_std::default_delete<assembler::TransportPDU>_>
           ._M_t.
           super__Tuple_impl<0UL,_assembler::TransportPDU_*,_std::default_delete<assembler::TransportPDU>_>
           .super__Head_base<0UL,_assembler::TransportPDU_*,_false>._M_head_impl;
  if (pTVar4 == (TransportPDU *)0x0) {
    uVar12 = bVar2 | uVar12;
    goto joined_r0x0012509f;
  }
  pbVar5 = *(byte **)&(pTVar4->header).
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>;
  __nbytes_00 = (long)*(pointer *)
                       ((long)&(pTVar4->header).
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_> + 8
                       ) - (long)pbVar5;
  uVar12 = bVar2 | uVar12;
  if (__nbytes_00 == 6) {
    __nbytes._M_head_impl = (TransportPDU *)0x6;
    if (uVar12 != 0x7ff) {
      __nbytes._M_head_impl =
           (TransportPDU *)(ulong)((uint)pbVar5[4] * 0x100 + (uint)pbVar5[5] + 1 & 0xffff);
      uVar14 = (*(long *)&(pTVar4->data).
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data -
               (long)*(pointer *)
                      ((long)&(pTVar4->data).
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_> + 8)
               ) + (long)__nbytes._M_head_impl;
      if (uVar12 < uVar14) {
        if ((((ulong)uVar12 != 0) || (uVar14 != 6)) ||
           (uVar13 = (*pbVar5 & 7) << 8, __nbytes._M_head_impl = (TransportPDU *)(ulong)uVar13,
           (pbVar5[1] | uVar13) != 0x7ff)) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"VC ",3);
          local_40 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,this->id_);
          std::__ostream_insert<char,std::char_traits<char>>
                    (local_40,": M_SDU continuation failed; ",0x1d);
          poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)local_40);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar10," byte(s) needed to complete M_SDU, ",0x23);
          poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)poVar10);
          std::__ostream_insert<char,std::char_traits<char>>(poVar10," byte(s) available",0x12);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
          std::ostream::put((char)poVar10);
          std::ostream::flush();
        }
        _Var6._M_head_impl =
             (this_00->_M_t).
             super___uniq_ptr_impl<assembler::TransportPDU,_std::default_delete<assembler::TransportPDU>_>
             ._M_t.
             super__Tuple_impl<0UL,_assembler::TransportPDU_*,_std::default_delete<assembler::TransportPDU>_>
             .super__Head_base<0UL,_assembler::TransportPDU_*,_false>._M_head_impl;
        (this_00->_M_t).
        super___uniq_ptr_impl<assembler::TransportPDU,_std::default_delete<assembler::TransportPDU>_>
        ._M_t.
        super__Tuple_impl<0UL,_assembler::TransportPDU_*,_std::default_delete<assembler::TransportPDU>_>
        .super__Head_base<0UL,_assembler::TransportPDU_*,_false>._M_head_impl = (TransportPDU *)0x0;
        if (_Var6._M_head_impl != (TransportPDU *)0x0) {
          std::default_delete<assembler::TransportPDU>::operator()
                    ((default_delete<assembler::TransportPDU> *)this_00,_Var6._M_head_impl);
        }
        sVar11 = 0;
        goto LAB_001251c3;
      }
    }
    sVar11 = TransportPDU::read(pTVar4,iVar9,(void *)0x374,(size_t)__nbytes._M_head_impl);
    __nbytes._M_head_impl =
         (this_00->_M_t).
         super___uniq_ptr_impl<assembler::TransportPDU,_std::default_delete<assembler::TransportPDU>_>
         ._M_t.
         super__Tuple_impl<0UL,_assembler::TransportPDU_*,_std::default_delete<assembler::TransportPDU>_>
         .super__Head_base<0UL,_assembler::TransportPDU_*,_false>._M_head_impl;
    lVar7 = *(long *)&(__nbytes._M_head_impl)->header;
    if (((long)*(pointer *)((long)&(__nbytes._M_head_impl)->header + 8) - lVar7 == 6) &&
       (uVar8 = &(__nbytes._M_head_impl)->data, pvVar1 = &(__nbytes._M_head_impl)->data,
       __nbytes._M_head_impl = (TransportPDU *)((ulong)*(byte *)(lVar7 + 4) << 8),
       (long)*(pointer *)(uVar8 + 8) -
       *(long *)&(pvVar1->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl
       == (ulong)((uint)*(byte *)(lVar7 + 5) + (int)__nbytes._M_head_impl + 1 & 0xffff))) {
      local_50._M_head_impl =
           (this->tpdu_)._M_t.
           super___uniq_ptr_impl<assembler::TransportPDU,_std::default_delete<assembler::TransportPDU>_>
           ._M_t.
           super__Tuple_impl<0UL,_assembler::TransportPDU_*,_std::default_delete<assembler::TransportPDU>_>
           .super__Head_base<0UL,_assembler::TransportPDU_*,_false>._M_head_impl;
      (this->tpdu_)._M_t.
      super___uniq_ptr_impl<assembler::TransportPDU,_std::default_delete<assembler::TransportPDU>_>.
      _M_t.
      super__Tuple_impl<0UL,_assembler::TransportPDU_*,_std::default_delete<assembler::TransportPDU>_>
      .super__Head_base<0UL,_assembler::TransportPDU_*,_false>._M_head_impl = (TransportPDU *)0x0;
      process(this,(unique_ptr<assembler::TransportPDU,_std::default_delete<assembler::TransportPDU>_>
                    *)&local_50,local_48);
      if (local_50._M_head_impl != (TransportPDU *)0x0) {
        std::default_delete<assembler::TransportPDU>::operator()
                  ((default_delete<assembler::TransportPDU> *)&local_50,local_50._M_head_impl);
      }
      local_50._M_head_impl = (TransportPDU *)0x0;
    }
  }
  else {
    sVar11 = TransportPDU::read(pTVar4,iVar9,(void *)0x374,__nbytes_00);
    __nbytes._M_head_impl =
         (this_00->_M_t).
         super___uniq_ptr_impl<assembler::TransportPDU,_std::default_delete<assembler::TransportPDU>_>
         ._M_t.
         super__Tuple_impl<0UL,_assembler::TransportPDU_*,_std::default_delete<assembler::TransportPDU>_>
         .super__Head_base<0UL,_assembler::TransportPDU_*,_false>._M_head_impl;
    lVar7 = *(long *)&(__nbytes._M_head_impl)->header;
    if (((long)*(pointer *)((long)&(__nbytes._M_head_impl)->header + 8) - lVar7 == 6) &&
       (uVar8 = &(__nbytes._M_head_impl)->data, pvVar1 = &(__nbytes._M_head_impl)->data,
       __nbytes._M_head_impl = (TransportPDU *)((ulong)*(byte *)(lVar7 + 4) << 8),
       (long)*(pointer *)(uVar8 + 8) -
       *(long *)&pvVar1->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_> ==
       (ulong)((uint)*(byte *)(lVar7 + 5) + (int)__nbytes._M_head_impl + 1 & 0xffff))) {
      local_58._M_head_impl =
           (this->tpdu_)._M_t.
           super___uniq_ptr_impl<assembler::TransportPDU,_std::default_delete<assembler::TransportPDU>_>
           ._M_t.
           super__Tuple_impl<0UL,_assembler::TransportPDU_*,_std::default_delete<assembler::TransportPDU>_>
           .super__Head_base<0UL,_assembler::TransportPDU_*,_false>._M_head_impl;
      (this->tpdu_)._M_t.
      super___uniq_ptr_impl<assembler::TransportPDU,_std::default_delete<assembler::TransportPDU>_>.
      _M_t.
      super__Tuple_impl<0UL,_assembler::TransportPDU_*,_std::default_delete<assembler::TransportPDU>_>
      .super__Head_base<0UL,_assembler::TransportPDU_*,_false>._M_head_impl = (TransportPDU *)0x0;
      process(this,(unique_ptr<assembler::TransportPDU,_std::default_delete<assembler::TransportPDU>_>
                    *)&local_58,local_48);
      if (local_58._M_head_impl != (TransportPDU *)0x0) {
        std::default_delete<assembler::TransportPDU>::operator()
                  ((default_delete<assembler::TransportPDU> *)&local_58,local_58._M_head_impl);
      }
      local_58._M_head_impl = (TransportPDU *)0x0;
    }
  }
LAB_001251c3:
  if (sVar11 == 0x374) {
    return local_48;
  }
joined_r0x0012509f:
  if (uVar12 < 0x374) {
    do {
      this_01._M_head_impl = (TransportPDU *)operator_new(0x30);
      TransportPDU::TransportPDU(this_01._M_head_impl);
      local_38 = (TransportPDU *)0x0;
      _Var6._M_head_impl =
           (this_00->_M_t).
           super___uniq_ptr_impl<assembler::TransportPDU,_std::default_delete<assembler::TransportPDU>_>
           ._M_t.
           super__Tuple_impl<0UL,_assembler::TransportPDU_*,_std::default_delete<assembler::TransportPDU>_>
           .super__Head_base<0UL,_assembler::TransportPDU_*,_false>._M_head_impl;
      (this_00->_M_t).
      super___uniq_ptr_impl<assembler::TransportPDU,_std::default_delete<assembler::TransportPDU>_>.
      _M_t.
      super__Tuple_impl<0UL,_assembler::TransportPDU_*,_std::default_delete<assembler::TransportPDU>_>
      .super__Head_base<0UL,_assembler::TransportPDU_*,_false>._M_head_impl = this_01._M_head_impl;
      if (_Var6._M_head_impl != (TransportPDU *)0x0) {
        std::default_delete<assembler::TransportPDU>::operator()
                  ((default_delete<assembler::TransportPDU> *)this_00,_Var6._M_head_impl);
      }
      if (local_38 != (TransportPDU *)0x0) {
        std::default_delete<assembler::TransportPDU>::operator()
                  ((default_delete<assembler::TransportPDU> *)&local_38,local_38);
      }
      sVar11 = TransportPDU::read((this_00->_M_t).
                                  super___uniq_ptr_impl<assembler::TransportPDU,_std::default_delete<assembler::TransportPDU>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_assembler::TransportPDU_*,_std::default_delete<assembler::TransportPDU>_>
                                  .super__Head_base<0UL,_assembler::TransportPDU_*,_false>.
                                  _M_head_impl,iVar9 + (int)uVar15,(void *)(0x374 - uVar15),
                                  (size_t)__nbytes._M_head_impl);
      __nbytes._M_head_impl =
           (this_00->_M_t).
           super___uniq_ptr_impl<assembler::TransportPDU,_std::default_delete<assembler::TransportPDU>_>
           ._M_t.
           super__Tuple_impl<0UL,_assembler::TransportPDU_*,_std::default_delete<assembler::TransportPDU>_>
           .super__Head_base<0UL,_assembler::TransportPDU_*,_false>._M_head_impl;
      lVar7 = *(long *)&(__nbytes._M_head_impl)->header;
      if (((long)*(pointer *)((long)&(__nbytes._M_head_impl)->header + 8) - lVar7 == 6) &&
         (uVar8 = &(__nbytes._M_head_impl)->data, pvVar1 = &(__nbytes._M_head_impl)->data,
         __nbytes._M_head_impl = (TransportPDU *)((ulong)*(byte *)(lVar7 + 4) << 8),
         (long)*(pointer *)(uVar8 + 8) -
         *(long *)&(pvVar1->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                   _M_impl ==
         (ulong)((uint)*(byte *)(lVar7 + 5) + (int)__nbytes._M_head_impl + 1 & 0xffff))) {
        local_60._M_head_impl =
             (this->tpdu_)._M_t.
             super___uniq_ptr_impl<assembler::TransportPDU,_std::default_delete<assembler::TransportPDU>_>
             ._M_t.
             super__Tuple_impl<0UL,_assembler::TransportPDU_*,_std::default_delete<assembler::TransportPDU>_>
             .super__Head_base<0UL,_assembler::TransportPDU_*,_false>._M_head_impl;
        (this->tpdu_)._M_t.
        super___uniq_ptr_impl<assembler::TransportPDU,_std::default_delete<assembler::TransportPDU>_>
        ._M_t.
        super__Tuple_impl<0UL,_assembler::TransportPDU_*,_std::default_delete<assembler::TransportPDU>_>
        .super__Head_base<0UL,_assembler::TransportPDU_*,_false>._M_head_impl = (TransportPDU *)0x0;
        process(this,(unique_ptr<assembler::TransportPDU,_std::default_delete<assembler::TransportPDU>_>
                      *)&local_60,local_48);
        if (local_60._M_head_impl != (TransportPDU *)0x0) {
          std::default_delete<assembler::TransportPDU>::operator()
                    ((default_delete<assembler::TransportPDU> *)&local_60,local_60._M_head_impl);
        }
        local_60._M_head_impl = (TransportPDU *)0x0;
      }
      uVar15 = uVar15 + sVar11;
    } while (uVar15 < 0x374);
  }
  return local_48;
}

Assistant:

std::vector<std::unique_ptr<SessionPDU>> VirtualChannel::process(const VCDU& vcdu) {
  std::vector<std::unique_ptr<SessionPDU>> out;
  uint16_t firstHeader;
  size_t pos;

  // Sanity check on VCDU counter (wraps at 2^24)
  if (n_ >= 0) {
    auto skip = diffWithWrap<(1 << 24)>(n_, vcdu.getCounter());

    // Abort processing of pending TP_PDU in case of drop.
    if (skip > 1) {
      std::cerr
        <<  "VC " << id_
        << ": VCDU drop! (lost " << (skip - 1)
        << "; prev: " << n_
        << "; packet: " << vcdu.getCounter()
        << ")"
        << std::endl;
      tpdu_.reset();
    }
  }

  // Update counter with current VCDU
  n_ = vcdu.getCounter();

  // Get iterators to begin/end of the VCDU Data Unit
  auto data = vcdu.data();
  auto len = vcdu.len();

  // Extract "first header pointer" field from M_PDU header
  firstHeader = ((data[0] & 0x7) << 8) | data[1];

  // Skip over M_PDU header
  data += 2;
  len -= 2;

  // Resume extracting a packet if we still have a pointer
  pos = 0;
  if (tpdu_) {
    // Double check that the number of bytes left to read correspond
    // with the first header pointer. The latter takes precedence.
    if (tpdu_->headerComplete()) {
      auto bytesNeeded = tpdu_->length() - tpdu_->data.size();
      // If the first header pointer is 2047, there is no additional
      // header in the VCDU and we can read the entire thing.
      auto bytesAvailable = (firstHeader == 2047) ? len : firstHeader;
      if (firstHeader != 2047 && bytesAvailable < bytesNeeded) {
        // Don't log error message for fill packets.
        // On the GOES-16 HRIT feed these can expect 6 more bytes
        // if they are aligned on the VCDU boundary. I suspect this
        // number comes from the the 6 header bytes in a VCDU and
        // that this is a mistake in the HRIT feed assembly code.
        if (!(bytesAvailable == 0 && bytesNeeded == 6 && tpdu_->apid() == 2047)) {
          std::cerr
            <<  "VC " << id_
            << ": M_SDU continuation failed; "
            << bytesNeeded << " byte(s) needed to complete M_SDU, "
            << bytesAvailable << " byte(s) available"
            << std::endl;
        }
        tpdu_.reset();
      } else {
        pos += tpdu_->read(&data[pos], len - pos);
        if (tpdu_->dataComplete()) {
          process(std::move(tpdu_), out);
        }
      }
    } else {
      pos += tpdu_->read(&data[pos], len - pos);
      if (tpdu_->dataComplete()) {
        process(std::move(tpdu_), out);
      }
    }

    // Return early if we consumed all bytes
    if (pos == len) {
      return out;
    }
  }

  // Must have pointer to first header to continue
  if (firstHeader == 2047) {
    return out;
  }

  // Extract TP_PDUs until there is no more data
  pos = firstHeader;
  while (pos < len) {
    tpdu_ = std::unique_ptr<TransportPDU>(new TransportPDU);
    pos += tpdu_->read(&data[pos], len - pos);
    if (tpdu_->dataComplete()) {
      process(std::move(tpdu_), out);
    }
  }

  return out;
}